

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_initialize_required_attr
          (exr_context_t ctxt,int part_index,exr_attr_box2i_t *displayWindow,
          exr_attr_box2i_t *dataWindow,float pixelaspectratio,exr_attr_v2f_t *screenWindowCenter,
          float screenWindowWidth,exr_lineorder_t lineorder,exr_compression_t ctype)

{
  exr_result_t eVar1;
  
  eVar1 = exr_set_compression(ctxt,part_index,ctype);
  if (eVar1 == 0) {
    eVar1 = exr_set_data_window(ctxt,part_index,dataWindow);
    if (eVar1 == 0) {
      eVar1 = exr_set_display_window(ctxt,part_index,displayWindow);
      if (eVar1 == 0) {
        eVar1 = exr_set_lineorder(ctxt,part_index,lineorder);
        if (eVar1 == 0) {
          eVar1 = exr_set_pixel_aspect_ratio(ctxt,part_index,pixelaspectratio);
          if (eVar1 == 0) {
            eVar1 = exr_set_screen_window_center(ctxt,part_index,screenWindowCenter);
            if (eVar1 == 0) {
              eVar1 = exr_set_screen_window_width(ctxt,part_index,screenWindowWidth);
              return eVar1;
            }
          }
        }
      }
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_initialize_required_attr (
    exr_context_t           ctxt,
    int                     part_index,
    const exr_attr_box2i_t* displayWindow,
    const exr_attr_box2i_t* dataWindow,
    float                   pixelaspectratio,
    const exr_attr_v2f_t*   screenWindowCenter,
    float                   screenWindowWidth,
    exr_lineorder_t         lineorder,
    exr_compression_t       ctype)
{
    exr_result_t rv;

    rv = exr_set_compression (ctxt, part_index, ctype);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_data_window (ctxt, part_index, dataWindow);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_display_window (ctxt, part_index, displayWindow);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_lineorder (ctxt, part_index, lineorder);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_pixel_aspect_ratio (ctxt, part_index, pixelaspectratio);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_screen_window_center (ctxt, part_index, screenWindowCenter);
    if (rv != EXR_ERR_SUCCESS) return rv;

    return exr_set_screen_window_width (ctxt, part_index, screenWindowWidth);
}